

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cdata.c
# Opt level: O0

void lj_cdata_set(CTState *cts,CType *d,uint8_t *dp,TValue *o,CTInfo qual)

{
  lua_State *in_RCX;
  ErrMsg *in_RSI;
  TValue *in_RDI;
  ErrMsg in_R8D;
  ErrMsg *local_a0;
  uint8_t *in_stack_ffffffffffffff70;
  CType *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  ErrMsg in_stack_ffffffffffffffa4;
  TValue *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffc0;
  
  if (*in_RSI >> 0x1c != 0xb) {
    if (*in_RSI >> 0x1c == 10) {
      if (((*in_RSI | in_R8D) & 0x2000000) == LJ_ERR_ERRMEM) {
        lj_cconv_bf_tv((CTState *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                       in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,in_RDI);
        return;
      }
    }
    else {
      local_a0 = (ErrMsg *)(in_RDI->u64 + (ulong)(*in_RSI & 0xffff) * 0x10);
      if ((*local_a0 & 0xf0800000) == 0x20800000) {
        in_stack_ffffffffffffffa4 = *local_a0 & 0xffff;
        local_a0 = (ErrMsg *)(in_RDI->u64 + (ulong)in_stack_ffffffffffffffa4 * 0x10);
        in_stack_ffffffffffffffa8 = in_RDI;
      }
      for (; *local_a0 >> 0x1c == 8;
          local_a0 = (ErrMsg *)(in_RDI->u64 + (ulong)(*local_a0 & 0xffff) * 0x10)) {
        if ((*local_a0 >> 0x10 & 0xff) == 1) {
          in_R8D = local_a0[1] | in_R8D;
        }
      }
      if (((*local_a0 | in_R8D) & 0x2000000) == LJ_ERR_ERRMEM) {
        lj_cconv_ct_tv((CTState *)(CONCAT44(*in_RSI,in_stack_ffffffffffffffc0) & 0xffffffffffff),
                       (CType *)&in_RDI->field_2,(uint8_t *)in_RSI,in_stack_ffffffffffffffa8,
                       in_stack_ffffffffffffffa4);
        return;
      }
    }
  }
  lj_err_caller(in_RCX,in_R8D);
}

Assistant:

void lj_cdata_set(CTState *cts, CType *d, uint8_t *dp, TValue *o, CTInfo qual)
{
  if (ctype_isconstval(d->info)) {
    goto err_const;
  } else if (ctype_isbitfield(d->info)) {
    if (((d->info|qual) & CTF_CONST)) goto err_const;
    lj_cconv_bf_tv(cts, d, dp, o);
    return;
  }

  /* Get child type of pointer/array/field. */
  lj_assertCTS(ctype_ispointer(d->info) || ctype_isfield(d->info),
	       "pointer or field expected");
  d = ctype_child(cts, d);

  /* Resolve reference for field. */
  if (ctype_isref(d->info)) {
    lj_assertCTS(d->size == CTSIZE_PTR, "ref is not pointer-sized");
    dp = *(uint8_t **)dp;
    d = ctype_child(cts, d);
  }

  /* Skip attributes and collect qualifiers. */
  for (;;) {
    if (ctype_isattrib(d->info)) {
      if (ctype_attrib(d->info) == CTA_QUAL) qual |= d->size;
    } else {
      break;
    }
    d = ctype_child(cts, d);
  }

  lj_assertCTS(ctype_hassize(d->info), "store to ctype without size");
  lj_assertCTS(!ctype_isvoid(d->info), "store to void type");

  if (((d->info|qual) & CTF_CONST)) {
  err_const:
    lj_err_caller(cts->L, LJ_ERR_FFI_WRCONST);
  }

  lj_cconv_ct_tv(cts, d, dp, o, 0);
}